

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

string * __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::getTECode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderTessellationInputPatchDiscard *this,
          _tessellation_primitive_mode primitive_mode)

{
  ulong uVar1;
  _tessellation_primitive_mode primitive_mode_00;
  string primitive_mode_string;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(PRIMITIVE_MODE) in;\n\nin  int   tc_primitive_id   [];\nout ivec2 te_tc_primitive_id;\nout int   te_primitive_id;\n\nvoid main()\n{\n    te_tc_primitive_id[0] = tc_primitive_id[0];\n    te_tc_primitive_id[1] = tc_primitive_id[1];\n    te_primitive_id       = gl_PrimitiveID;\n}\n"
             ,"");
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            (&local_40,(TessellationShaderUtils *)(ulong)primitive_mode,primitive_mode_00);
  uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b6c77e,0);
  while (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,(char *)0xe,(ulong)local_40._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b6c77e,0);
    uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1b6c77e,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTessellationInputPatchDiscard::getTECode(_tessellation_primitive_mode primitive_mode)
{
	std::string result = "${VERSION}\n"
						 "\n"
						 "${TESSELLATION_SHADER_REQUIRE}\n"
						 "\n"
						 "layout(PRIMITIVE_MODE) in;\n"
						 "\n"
						 "in  int   tc_primitive_id   [];\n"
						 "out ivec2 te_tc_primitive_id;\n"
						 "out int   te_primitive_id;\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "    te_tc_primitive_id[0] = tc_primitive_id[0];\n"
						 "    te_tc_primitive_id[1] = tc_primitive_id[1];\n"
						 "    te_primitive_id       = gl_PrimitiveID;\n"
						 "}\n";

	/* Replace PRIMITIVE_MODE token with actual primitive_mode */
	std::string primitive_mode_string	  = TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
	const char* primitive_mode_token	   = "PRIMITIVE_MODE";
	std::size_t primitive_mode_token_index = std::string::npos;

	while ((primitive_mode_token_index = result.find(primitive_mode_token)) != std::string::npos)
	{
		result = result.replace(primitive_mode_token_index, strlen(primitive_mode_token), primitive_mode_string);

		primitive_mode_token_index = result.find(primitive_mode_token);
	}

	/* Done */
	return result;
}